

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int __thiscall ACSStringPool::AddString(ACSStringPool *this,char *str)

{
  DWORD h_00;
  size_t len_00;
  FString local_40;
  FString fstr;
  int i;
  uint bucketnum;
  uint h;
  size_t len;
  char *str_local;
  ACSStringPool *this_local;
  
  len_00 = strlen(str);
  h_00 = SuperFastHash(str,len_00);
  fstr.Chars._4_4_ = FindString(this,str,len_00,h_00,h_00 % 0xfb);
  if ((int)fstr.Chars._4_4_ < 0) {
    FString::FString(&local_40,str);
    this_local._4_4_ = InsertString(this,&local_40,h_00,h_00 % 0xfb);
    FString::~FString(&local_40);
  }
  else {
    this_local._4_4_ = fstr.Chars._4_4_ | 0x7ff00000;
  }
  return this_local._4_4_;
}

Assistant:

int ACSStringPool::AddString(const char *str)
{
	size_t len = strlen(str);
	unsigned int h = SuperFastHash(str, len);
	unsigned int bucketnum = h % NUM_BUCKETS;
	int i = FindString(str, len, h, bucketnum);
	if (i >= 0)
	{
		return i | STRPOOL_LIBRARYID_OR;
	}
	FString fstr(str);
	return InsertString(fstr, h, bucketnum);
}